

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  char *p_00;
  undefined1 *puVar8;
  ulong uVar9;
  long lVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  int iVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  long in_FS_OFFSET;
  char *p;
  char *p2;
  char *p1;
  u64 iVal;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  *paOut = (char *)0x0;
  *pnOut = 0;
  local_50 = a2;
  local_48 = a1;
  iVar6 = sqlite3_initialize();
  if (iVar6 == 0) {
    p_00 = (char *)sqlite3Malloc((long)n1 + (long)n2 + 0x11);
  }
  else {
    p_00 = (char *)0x0;
  }
  if (p_00 == (char *)0x0) {
    iVar6 = 7;
  }
  else {
    local_58 = p_00;
    if (n1 < 1) {
      local_48 = (char *)0x0;
      puVar11 = (undefined1 *)0x0;
    }
    else {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = sqlite3Fts3GetVarintU(a1,(sqlite_uint64 *)&local_40);
      local_48 = a1 + iVar6;
      puVar11 = local_40;
    }
    if (n2 < 1) {
      local_50 = (char *)0x0;
      puVar14 = (undefined1 *)0x0;
    }
    else {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = sqlite3Fts3GetVarintU(a2,(sqlite_uint64 *)&local_40);
      local_50 = a2 + iVar6;
      puVar14 = local_40;
    }
    puVar8 = (undefined1 *)0x0;
    bVar1 = true;
    iVar6 = 0;
    do {
      if (local_48 == (char *)0x0 && local_50 == (char *)0x0) break;
      iVar7 = -(uint)(puVar11 != puVar14);
      if ((long)puVar14 < (long)puVar11) {
        iVar7 = 1;
      }
      iVar13 = -iVar7;
      if (bDescDoclist == 0) {
        iVar13 = iVar7;
      }
      puVar12 = puVar14;
      puVar15 = puVar11;
      if (((local_48 == (char *)0x0) || (local_50 == (char *)0x0)) || (iVar13 != 0)) {
        if ((local_50 == (char *)0x0) || (local_48 != (char *)0x0 && iVar13 < 0)) {
          uVar9 = (long)puVar8 - (long)puVar11;
          if (bDescDoclist == 0 || bVar1) {
            uVar9 = (long)puVar11 - (long)puVar8;
          }
          lVar5 = 0;
          do {
            lVar10 = lVar5;
            bVar2 = (byte)uVar9;
            local_58[lVar10] = bVar2 | 0x80;
            bVar1 = 0x7f < uVar9;
            lVar5 = lVar10 + 1;
            uVar9 = uVar9 >> 7;
          } while (bVar1);
          local_58[lVar10] = bVar2;
          local_58 = local_58 + lVar10 + 1;
          fts3PoslistCopy(&local_58,&local_48);
          pcVar4 = local_48;
          if (local_48 < a1 + n1) {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar7 = sqlite3Fts3GetVarintU(local_48,(sqlite_uint64 *)&local_40);
            local_48 = pcVar4 + iVar7;
            puVar14 = (undefined1 *)-(long)local_40;
            if (bDescDoclist == 0) {
              puVar14 = local_40;
            }
            bVar3 = true;
            puVar15 = puVar14 + (long)puVar11;
            puVar8 = puVar11;
          }
          else {
            local_48 = (char *)0x0;
            bVar3 = true;
            puVar8 = puVar11;
          }
        }
        else {
          uVar9 = (long)puVar8 - (long)puVar14;
          if ((bool)(bDescDoclist == 0 | bVar1)) {
            uVar9 = (long)puVar14 - (long)puVar8;
          }
          lVar5 = 0;
          do {
            lVar10 = lVar5;
            bVar2 = (byte)uVar9;
            local_58[lVar10] = bVar2 | 0x80;
            bVar1 = 0x7f < uVar9;
            lVar5 = lVar10 + 1;
            uVar9 = uVar9 >> 7;
          } while (bVar1);
          local_58[lVar10] = bVar2;
          local_58 = local_58 + lVar10 + 1;
          fts3PoslistCopy(&local_58,&local_50);
          pcVar4 = local_50;
          if (local_50 < a2 + n2) {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar7 = sqlite3Fts3GetVarintU(local_50,(sqlite_uint64 *)&local_40);
            local_50 = pcVar4 + iVar7;
            puVar11 = (undefined1 *)-(long)local_40;
            if (bDescDoclist == 0) {
              puVar11 = local_40;
            }
            puVar12 = puVar11 + (long)puVar14;
          }
          else {
            local_50 = (char *)0x0;
          }
          bVar3 = true;
          puVar8 = puVar14;
        }
      }
      else {
        uVar9 = (long)puVar8 - (long)puVar11;
        if (bVar1) {
          uVar9 = (long)puVar11 - (long)puVar8;
        }
        if (bDescDoclist == 0) {
          uVar9 = (long)puVar11 - (long)puVar8;
        }
        lVar5 = 0;
        do {
          lVar10 = lVar5;
          bVar2 = (byte)uVar9;
          local_58[lVar10] = bVar2 | 0x80;
          bVar1 = 0x7f < uVar9;
          lVar5 = lVar10 + 1;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        local_58[lVar10] = bVar2;
        local_58 = local_58 + lVar10 + 1;
        iVar6 = fts3PoslistMerge(&local_58,&local_48,&local_50);
        pcVar4 = local_48;
        if (iVar6 == 0) {
          if (local_48 < a1 + n1) {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar6 = sqlite3Fts3GetVarintU(local_48,(sqlite_uint64 *)&local_40);
            local_48 = pcVar4 + iVar6;
            puVar8 = (undefined1 *)-(long)local_40;
            if (bDescDoclist == 0) {
              puVar8 = local_40;
            }
            puVar15 = puVar8 + (long)puVar11;
          }
          else {
            local_48 = (char *)0x0;
          }
          pcVar4 = local_50;
          if (local_50 < a2 + n2) {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar6 = sqlite3Fts3GetVarintU(local_50,(sqlite_uint64 *)&local_40);
            local_50 = pcVar4 + iVar6;
            puVar8 = (undefined1 *)-(long)local_40;
            if (bDescDoclist == 0) {
              puVar8 = local_40;
            }
            bVar3 = true;
            iVar6 = 0;
            puVar12 = puVar8 + (long)puVar14;
            puVar8 = puVar11;
          }
          else {
            local_50 = (char *)0x0;
            bVar3 = true;
            iVar6 = 0;
            puVar8 = puVar11;
          }
        }
        else {
          bVar3 = false;
          puVar8 = puVar11;
        }
      }
      bVar1 = false;
      puVar11 = puVar15;
      puVar14 = puVar12;
    } while (bVar3);
    if (iVar6 == 0) {
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
    }
    else {
      sqlite3_free(p_00);
      local_58 = (char *)0x0;
      p_00 = (char *)0x0;
    }
    *paOut = p_00;
    *pnOut = (int)local_58 - (int)p_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow.
  **
  ** A symetric argument may be made if the doclists are in descending
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }

    assert( (p-aOut)<=((p1?(p1-a1):n1)+(p2?(p2-a2):n2)+FTS3_VARINT_MAX-1) );
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}